

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O3

Cnf_Dat_t * Cnf_ManWriteCnfOther(Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  size_t __size;
  char cVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  char *pcVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  Cnf_Dat_t *pCVar10;
  int **ppiVar11;
  int *piVar12;
  int *piVar13;
  Vec_Int_t *pVVar14;
  int *__ptr;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  Aig_Man_t *pAVar20;
  Vec_Ptr_t *pVVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  int **ppiVar26;
  int iVar27;
  int iVar28;
  Vec_Int_t *pVVar29;
  int pVars [32];
  int local_b8 [34];
  
  pAVar20 = p->pManAig;
  iVar9 = pAVar20->nObjs[3] * 4 + 1;
  iVar28 = pAVar20->nObjs[3] * 2 + 1;
  iVar3 = vMapped->nSize;
  if (0 < (long)iVar3) {
    ppvVar5 = vMapped->pArray;
    lVar24 = 0;
    do {
      if ((*(uint *)((long)ppvVar5[lVar24] + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x1b2,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      pcVar6 = *(char **)((long)ppvVar5[lVar24] + 0x28);
      cVar1 = *pcVar6;
      if ((long)cVar1 < 5) {
        uVar2 = *(ushort *)(pcVar6 + (long)cVar1 * 4 + 0x18);
        cVar1 = p->pSopSizes[uVar2];
        lVar17 = (long)cVar1;
        if (lVar17 < 1) {
          if (cVar1 < '\0') {
            __assert_fail("p->pSopSizes[uTruth] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                          ,0x1b9,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
          }
          iVar22 = iVar9 + cVar1;
          lVar17 = 0;
        }
        else {
          lVar25 = 0;
          iVar22 = 0;
          do {
            iVar27 = 4;
            iVar16 = (int)p->pSops[uVar2][lVar25];
            do {
              iVar22 = iVar22 + (uint)(iVar16 % 3 != 2);
              iVar27 = iVar27 + -1;
              iVar16 = iVar16 / 3;
            } while (iVar27 != 0);
            lVar25 = lVar25 + 1;
          } while (lVar25 != lVar17);
          iVar22 = iVar9 + cVar1 + iVar22;
        }
        cVar1 = p->pSopSizes[(ulong)uVar2 ^ 0xffff];
        uVar18 = (ulong)cVar1;
        if ((long)uVar18 < 1) {
          iVar9 = 0;
        }
        else {
          uVar23 = 0;
          iVar9 = 0;
          do {
            iVar27 = 4;
            iVar16 = (int)p->pSops[(ulong)uVar2 ^ 0xffff][uVar23];
            do {
              iVar9 = iVar9 + (uint)(iVar16 % 3 != 2);
              iVar27 = iVar27 + -1;
              iVar16 = iVar16 / 3;
            } while (iVar27 != 0);
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar18);
        }
        if (cVar1 < '\0') {
          __assert_fail("p->pSopSizes[uTruth] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                        ,0x1c6,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
        }
        iVar16 = (int)lVar17;
        iVar9 = iVar9 + cVar1;
      }
      else {
        pVVar14 = *(Vec_Int_t **)(pcVar6 + 0x10);
        iVar22 = Cnf_IsopCountLiterals(pVVar14,(int)cVar1);
        iVar16 = pVVar14->nSize;
        iVar22 = iVar22 + iVar9 + iVar16;
        pVVar14 = *(Vec_Int_t **)(pcVar6 + 8);
        iVar9 = Cnf_IsopCountLiterals(pVVar14,(int)cVar1);
        uVar4 = pVVar14->nSize;
        uVar18 = (ulong)uVar4;
        iVar9 = iVar9 + uVar4;
      }
      iVar9 = iVar22 + iVar9;
      iVar28 = iVar28 + iVar16 + (int)uVar18;
      lVar24 = lVar24 + 1;
    } while (lVar24 != iVar3);
  }
  pCVar10 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar10->pMan = pAVar20;
  pCVar10->nLiterals = iVar9;
  pCVar10->nClauses = iVar28;
  lVar24 = (long)iVar28;
  ppiVar11 = (int **)malloc(lVar24 * 8 + 8);
  pCVar10->pClauses = ppiVar11;
  lVar17 = (long)iVar9;
  piVar12 = (int *)malloc(lVar17 * 4);
  *ppiVar11 = piVar12;
  ppiVar11[lVar24] = piVar12 + lVar17;
  pVVar21 = pAVar20->vObjs;
  iVar9 = pVVar21->nSize;
  __size = (long)iVar9 * 4;
  piVar13 = (int *)malloc(__size);
  pCVar10->pObj2Clause = piVar13;
  piVar12 = (int *)malloc(__size);
  pCVar10->pObj2Count = piVar12;
  if (0 < (long)iVar9) {
    lVar25 = 0;
    do {
      piVar12[lVar25] = -1;
      piVar13[lVar25] = -1;
      lVar25 = lVar25 + 1;
      iVar9 = pVVar21->nSize;
    } while (lVar25 < iVar9);
  }
  pCVar10->nVars = iVar9;
  pVVar21 = pAVar20->vCis;
  if (0 < pVVar21->nSize) {
    ppvVar5 = pVVar21->pArray;
    lVar25 = 0;
    do {
      piVar12[*(int *)((long)ppvVar5[lVar25] + 0x24)] = 0;
      lVar25 = lVar25 + 1;
    } while (lVar25 < pVVar21->nSize);
  }
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = 0x10000;
  pVVar14->nSize = 0;
  __ptr = (int *)malloc(0x40000);
  pVVar14->pArray = __ptr;
  piVar13 = *ppiVar11;
  if (0 < iVar3) {
    lVar25 = 0;
    do {
      pvVar7 = vMapped->pArray[lVar25];
      pCVar10->pObj2Clause[*(int *)((long)pvVar7 + 0x24)] =
           (int)((ulong)((long)ppiVar11 - (long)pCVar10->pClauses) >> 3);
      piVar12[*(int *)((long)pvVar7 + 0x24)] = 0;
      pcVar6 = *(char **)((long)pvVar7 + 0x28);
      iVar9 = *(int *)((long)pvVar7 + 0x24);
      cVar1 = *pcVar6;
      lVar15 = (long)cVar1;
      if (lVar15 < 1) {
LAB_00566923:
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar6 + lVar15 * 4 + 0x18)],
                   (int)p->pSopSizes[*(ushort *)(pcVar6 + lVar15 * 4 + 0x18)],pVVar14);
        pVVar29 = pVVar14;
      }
      else {
        iVar28 = p->pManAig->vObjs->nSize;
        lVar19 = 0;
        do {
          iVar3 = *(int *)(pcVar6 + lVar19 * 4 + 0x18);
          local_b8[lVar19] = iVar3;
          if (iVar28 < iVar3) {
            __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                          ,500,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
          }
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
        if (cVar1 < '\x05') goto LAB_00566923;
        pVVar29 = *(Vec_Int_t **)(pcVar6 + 0x10);
      }
      iVar28 = pVVar29->nSize;
      if (0 < iVar28) {
        lVar15 = 0;
        lVar19 = 0;
        do {
          iVar28 = pVVar29->pArray[lVar19];
          ppiVar11[lVar19] = piVar13;
          *piVar13 = iVar9 * 2;
          iVar28 = Cnf_IsopWriteCube(iVar28,(int)*pcVar6,local_b8,piVar13 + 1);
          piVar13 = piVar13 + (long)iVar28 + 1;
          lVar19 = lVar19 + 1;
          iVar28 = pVVar29->nSize;
          lVar15 = lVar15 + 8;
        } while (lVar19 < iVar28);
        piVar12 = pCVar10->pObj2Count;
        ppiVar11 = (int **)((long)ppiVar11 + lVar15);
      }
      piVar12[*(int *)((long)pvVar7 + 0x24)] = piVar12[*(int *)((long)pvVar7 + 0x24)] + iVar28;
      if ((long)*pcVar6 < 5) {
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar6 + (long)*pcVar6 * 4 + 0x18) ^ 0xffff],
                   (int)p->pSopSizes[*(ushort *)(pcVar6 + (long)*pcVar6 * 4 + 0x18) ^ 0xffff],
                   pVVar14);
        pVVar29 = pVVar14;
      }
      else {
        pVVar29 = *(Vec_Int_t **)(pcVar6 + 8);
      }
      iVar28 = pVVar29->nSize;
      if (0 < iVar28) {
        lVar15 = 0;
        lVar19 = 0;
        do {
          iVar28 = pVVar29->pArray[lVar19];
          ppiVar11[lVar19] = piVar13;
          *piVar13 = iVar9 * 2 + 1;
          iVar28 = Cnf_IsopWriteCube(iVar28,(int)*pcVar6,local_b8,piVar13 + 1);
          piVar13 = piVar13 + (long)iVar28 + 1;
          lVar19 = lVar19 + 1;
          iVar28 = pVVar29->nSize;
          lVar15 = lVar15 + 8;
        } while (lVar19 < iVar28);
        piVar12 = pCVar10->pObj2Count;
        ppiVar11 = (int **)((long)ppiVar11 + lVar15);
      }
      piVar12[*(int *)((long)pvVar7 + 0x24)] = piVar12[*(int *)((long)pvVar7 + 0x24)] + iVar28;
      lVar25 = lVar25 + 1;
    } while (lVar25 < vMapped->nSize);
    __ptr = pVVar14->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(pVVar14);
  pAVar20 = p->pManAig;
  pVVar21 = pAVar20->vCos;
  if (0 < pVVar21->nSize) {
    lVar25 = 0;
    ppiVar26 = ppiVar11;
    do {
      pvVar7 = pVVar21->pArray[lVar25];
      pCVar10->pObj2Clause[*(int *)((long)pvVar7 + 0x24)] =
           (int)((ulong)((long)ppiVar11 - (long)pCVar10->pClauses) >> 3);
      pCVar10->pObj2Count[*(int *)((long)pvVar7 + 0x24)] = 2;
      iVar9 = *(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24);
      iVar28 = *(int *)((long)pvVar7 + 0x24);
      *ppiVar26 = piVar13;
      *piVar13 = iVar28 * 2;
      piVar13[1] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar9 * 2 ^ 1;
      ppiVar26[1] = piVar13 + 2;
      ppiVar26 = ppiVar26 + 2;
      piVar13[2] = iVar28 * 2 + 1;
      piVar13[3] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar9 * 2;
      piVar13 = piVar13 + 4;
      lVar25 = lVar25 + 1;
      pAVar20 = p->pManAig;
      pVVar21 = pAVar20->vCos;
      ppiVar11 = ppiVar11 + 2;
    } while (lVar25 < pVVar21->nSize);
    piVar12 = pCVar10->pObj2Count;
    ppiVar11 = ppiVar26;
  }
  pAVar8 = pAVar20->pConst1;
  pCVar10->pObj2Clause[pAVar8->Id] = (int)((ulong)((long)ppiVar11 - (long)pCVar10->pClauses) >> 3);
  piVar12[pAVar8->Id] = 1;
  iVar9 = pAVar8->Id;
  *ppiVar11 = piVar13;
  *piVar13 = iVar9 * 2;
  if ((long)piVar13 + (4 - (long)*pCVar10->pClauses) >> 2 != lVar17) {
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x237,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
  }
  if ((long)ppiVar11 + (8 - (long)pCVar10->pClauses) >> 3 != lVar24) {
    __assert_fail("pClas - pCnf->pClauses == nClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x238,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
  }
  return pCVar10;
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnfOther( Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube;

    // count the number of literals and clauses
    nLiterals = 1 + 4 * Aig_ManCoNum( p->pManAig );
    nClauses  = 1 + 2 * Aig_ManCoNum( p->pManAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );
        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
    }

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses  = nClauses;
    pCnf->pClauses  = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pObj2Clause = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    pCnf->pObj2Count  = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pObj2Clause[i] = pCnf->pObj2Count[i] = -1;
    pCnf->nVars = Aig_ManObjNumMax(p->pManAig);

    // clear the PI counters
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pCnf->pObj2Count[pObj->Id] = 0;

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 0;

        // get the best cut
        pCut = Cnf_ObjBestCut( pObj );
        // save variables of this cut
        OutVar = pObj->Id;
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCut->pFanins[k];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);
    }
    Vec_IntFree( vSopTemp );

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 2;
        // get variables
        OutVar = Aig_ObjFanin0(pObj)->Id;
        PoVar = pObj->Id;
        // first clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar; 
        *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
        // second clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
        *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
    }
 
    // remember the starting clause
    pCnf->pObj2Clause[Aig_ManConst1(p->pManAig)->Id] = pClas - pCnf->pClauses;
    pCnf->pObj2Count[Aig_ManConst1(p->pManAig)->Id] = 1;
    // write the constant literal
    OutVar = Aig_ManConst1(p->pManAig)->Id;
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}